

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall CCoinsViewCache::Flush(CCoinsViewCache *this)

{
  CCoinsView *pCVar1;
  int iVar2;
  long in_FS_OFFSET;
  CoinsViewCacheCursor cursor;
  size_t *local_48;
  CoinsCachePair *local_40;
  CCoinsMap *local_38;
  undefined1 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &this->m_sentinel;
  local_30 = 1;
  pCVar1 = (this->super_CCoinsViewBacked).base;
  local_48 = &this->cachedCoinsUsage;
  local_38 = &this->cacheCoins;
  iVar2 = (*pCVar1->_vptr_CCoinsView[4])(pCVar1,&local_48,&this->hashBlock);
  if (SUB41(iVar2,0) != false) {
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->cacheCoins)._M_h);
    ReallocateCache(this);
  }
  this->cachedCoinsUsage = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::Flush() {
    auto cursor{CoinsViewCacheCursor(cachedCoinsUsage, m_sentinel, cacheCoins, /*will_erase=*/true)};
    bool fOk = base->BatchWrite(cursor, hashBlock);
    if (fOk) {
        cacheCoins.clear();
        ReallocateCache();
    }
    cachedCoinsUsage = 0;
    return fOk;
}